

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O0

void __thiscall
optimization::const_merge::Merge_Const::spread_var(Merge_Const *this,VarId *var,int val)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  reference ppVar5;
  value_type *pvVar6;
  pointer pIVar7;
  pair<const_mir::inst::VarId,_int> *this_00;
  char *pcVar8;
  undefined4 in_EDX;
  uint extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int __c;
  Merge_Const *in_RSI;
  pointer_____offset_0x10___ *__s;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_>,_bool> pVar9;
  undefined1 auVar10 [12];
  VarId rhs;
  VarId lhs;
  OpInst *opInst;
  AssignInst *assignInst;
  Inst *is;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  pair<int,_int> *usepoint;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  undefined4 in_stack_fffffffffffffea8;
  int32_t in_stack_fffffffffffffeac;
  pair<int,_int> in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *in_stack_fffffffffffffec0;
  key_type *in_stack_fffffffffffffec8;
  map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *in_stack_fffffffffffffed0;
  undefined1 local_118 [40];
  int local_f0;
  undefined1 local_e8 [40];
  int local_c0;
  pair<int,_int> local_b8;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_> in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  undefined4 in_stack_ffffffffffffffe8;
  Merge_Const *this_01;
  
  this_01 = in_RSI;
  std::__shared_ptr_access<optimization::const_merge::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<optimization::const_merge::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x19bcbc);
  sVar3 = std::
          map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::count(in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->first);
  if (sVar3 != 0) {
    std::
    __shared_ptr_access<optimization::const_merge::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<optimization::const_merge::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x19bce4);
    pmVar4 = std::
             map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::at(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_28._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_fffffffffffffeb0,
                              (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
          bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_28);
      std::
      __shared_ptr_access<optimization::const_merge::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::const_merge::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19bd66);
      __s = *(pointer_____offset_0x10___ **)ppVar5;
      Env::get_inst((Env *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                    in_stack_fffffffffffffeb0);
      pvVar6 = (value_type *)
               std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          in_stack_fffffffffffffeb0);
      pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x19bdb3);
      iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 0) {
        if (pvVar6 != (value_type *)0x0) {
          __dynamic_cast(pvVar6,&mir::inst::Inst::typeinfo,&mir::inst::AssignInst::typeinfo,0);
        }
        mir::inst::Value::Value((Value *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        mir::inst::Value::operator=
                  ((Value *)in_stack_fffffffffffffeb0,
                   (Value *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        this_00 = (pair<const_mir::inst::VarId,_int> *)(in_RDI + 8);
        std::pair<const_mir::inst::VarId,_int>::pair<mir::inst::VarId_&,_int_&,_true>
                  (this_00,&in_stack_fffffffffffffeb8->first,(int *)in_stack_fffffffffffffeb0);
        pVar9 = std::
                map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                ::insert((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                          *)this_00,in_stack_fffffffffffffeb8);
        in_stack_ffffffffffffff60 = pVar9.first._M_node;
        in_stack_ffffffffffffff68 = pVar9.second;
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffffeb0,
                   (VarId *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        spread_var(this_01,(VarId *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   (int)((ulong)pmVar4 >> 0x20));
      }
      else {
        if (pvVar6 == (value_type *)0x0) {
          auVar10._4_8_ = 0;
          auVar10._0_4_ = extraout_EDX;
          auVar10 = auVar10 << 0x40;
          in_stack_fffffffffffffeb8 = pvVar6;
        }
        else {
          __s = &mir::inst::Inst::typeinfo;
          auVar10 = __dynamic_cast(pvVar6,&mir::inst::Inst::typeinfo,&mir::inst::OpInst::typeinfo,0)
          ;
          in_stack_fffffffffffffeb8 = pvVar6;
        }
        in_stack_fffffffffffffeb0 = auVar10._0_8_;
        local_b8 = in_stack_fffffffffffffeb0;
        pcVar8 = std::variant<int,_mir::inst::VarId>::index
                           ((variant<int,_mir::inst::VarId> *)
                            ((long)in_stack_fffffffffffffeb0 + 0x20),(char *)__s,auVar10._8_4_);
        iVar2 = extraout_EDX_00;
        if (pcVar8 == (char *)0x1) {
          __s = (pointer_____offset_0x10___ *)
                std::get<mir::inst::VarId,int,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)0x19bf41);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffffeb0,
                     (VarId *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          iVar2 = extraout_EDX_01;
          if (local_c0 == *(int *)&(in_RSI->const_var_map)._M_t._M_impl) {
            mir::inst::Value::Value((Value *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
            __s = (pointer_____offset_0x10___ *)local_e8;
            mir::inst::Value::operator=
                      ((Value *)in_stack_fffffffffffffeb0,
                       (Value *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            iVar2 = extraout_EDX_02;
          }
        }
        pcVar8 = std::variant<int,_mir::inst::VarId>::index
                           ((variant<int,_mir::inst::VarId> *)((long)local_b8 + 0x40),(char *)__s,
                            iVar2);
        iVar2 = extraout_EDX_03;
        if (pcVar8 == (char *)0x1) {
          __s = (pointer_____offset_0x10___ *)
                std::get<mir::inst::VarId,int,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)0x19bfbb);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffffeb0,
                     (VarId *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          iVar2 = extraout_EDX_04;
          if (local_f0 == *(int *)&(in_RSI->const_var_map)._M_t._M_impl) {
            mir::inst::Value::Value((Value *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
            __s = (pointer_____offset_0x10___ *)local_118;
            mir::inst::Value::operator=
                      ((Value *)in_stack_fffffffffffffeb0,
                       (Value *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            iVar2 = extraout_EDX_05;
          }
        }
        pcVar8 = std::variant<int,_mir::inst::VarId>::index
                           ((variant<int,_mir::inst::VarId> *)((long)local_b8 + 0x20),(char *)__s,
                            iVar2);
        if ((pcVar8 == (char *)0x0) &&
           (pcVar8 = std::variant<int,_mir::inst::VarId>::index
                               ((variant<int,_mir::inst::VarId> *)((long)local_b8 + 0x40),
                                (char *)__s,__c), pcVar8 == (char *)0x0)) {
          optimize_inst((Merge_Const *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68)
                        ,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_ffffffffffffff60._M_node);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void spread_var(mir::inst::VarId var, int val) {
    if (!env->usepoints.count(var)) {
      return;
    }
    for (auto& usepoint : env->usepoints.at(var)) {
      auto& inst = env->get_inst(usepoint);
      auto& is = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Assign) {
        auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&is);
        assignInst->src = val;
        const_var_map.insert({assignInst->dest, val});
        spread_var(assignInst->dest, val);
      } else {
        auto opInst = dynamic_cast<mir::inst::OpInst*>(&is);
        if (opInst->lhs.index() == 1) {
          auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
          if (lhs.id == var.id) {
            opInst->lhs = val;
          }
        }
        if (opInst->rhs.index() == 1) {
          auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
          if (rhs.id == var.id) {
            opInst->rhs = val;
          }
        }
        if (opInst->lhs.index() == 0 && opInst->rhs.index() == 0) {
          optimize_inst(inst);
        }
      }
    }
  }